

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.h
# Opt level: O1

void __thiscall CGL::Matrix3x3::Matrix3x3(Matrix3x3 *this)

{
  long lVar1;
  undefined8 *puVar2;
  int i;
  int iVar3;
  int j;
  int iVar4;
  undefined8 uVar5;
  
  lVar1 = 0;
  do {
    puVar2 = (undefined8 *)((long)&this->entries[0].field_0 + lVar1);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)&this->entries[0].field_0 + lVar1 + 0x10) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  iVar3 = 0;
  do {
    iVar4 = 0;
    do {
      uVar5 = 0x3ff0000000000000;
      if (iVar3 != iVar4) {
        uVar5 = 0;
      }
      puVar2 = (undefined8 *)CGL::Matrix3x3::operator()((int)this,iVar3);
      *puVar2 = uVar5;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  return;
}

Assistant:

Matrix3x3(void) { 
    for( int i = 0; i < 3; i++ ) {
      for( int j = 0; j < 3; j++ ) {
        (*this)(i,j) = (i==j) ? 1. : 0.;
      }
    }
  }